

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnglite.c
# Opt level: O3

void png_filter_paeth(int stride,uchar *in,uchar *out,uchar *prev_line,int len)

{
  uint uVar1;
  long lVar2;
  byte bVar3;
  byte bVar4;
  ulong uVar5;
  byte bVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  
  if (0 < len) {
    lVar2 = (long)stride;
    uVar5 = 0;
    do {
      if ((long)uVar5 < lVar2 || prev_line == (uchar *)0x0) {
        if (prev_line == (uchar *)0x0) {
          bVar3 = 0;
        }
        else {
          bVar3 = prev_line[uVar5];
        }
        if ((long)uVar5 < lVar2) {
          bVar6 = 0;
        }
        else {
          bVar6 = out[uVar5 - lVar2];
        }
        bVar4 = 0;
      }
      else {
        bVar6 = out[uVar5 - lVar2];
        bVar3 = prev_line[uVar5];
        bVar4 = prev_line[uVar5 - lVar2];
      }
      iVar8 = ((uint)bVar3 + (uint)bVar6) - (uint)bVar4;
      uVar10 = iVar8 - (uint)bVar6;
      uVar1 = -uVar10;
      if (0 < (int)uVar10) {
        uVar1 = uVar10;
      }
      uVar7 = iVar8 - (uint)bVar3;
      uVar10 = -uVar7;
      if (0 < (int)uVar7) {
        uVar10 = uVar7;
      }
      uVar9 = iVar8 - (uint)bVar4;
      uVar7 = -uVar9;
      if (0 < (int)uVar9) {
        uVar7 = uVar9;
      }
      if (uVar10 <= uVar7) {
        bVar4 = bVar3;
      }
      if (uVar7 < uVar1) {
        bVar6 = bVar4;
      }
      if (uVar10 < uVar1) {
        bVar6 = bVar4;
      }
      out[uVar5] = bVar6 + in[uVar5];
      uVar5 = uVar5 + 1;
    } while ((uint)len != uVar5);
  }
  return;
}

Assistant:

static void png_filter_paeth(int stride, unsigned char* in, unsigned char* out, unsigned char* prev_line, int len)
{
	int i;
	unsigned char a;
	unsigned char b;
	unsigned char c;

	for(i = 0; i < len; i++)
	{
		if(prev_line && i >= stride)
		{
			a = out[i - stride];
			b = prev_line[i];
			c = prev_line[i - stride];
		}
		else
		{
			if(prev_line)
				b = prev_line[i];
			else
				b = 0;
	
			if(i >= stride)
				a = out[i - stride];
			else
				a = 0;

			c = 0;
		}

		out[i] = in[i] + png_paeth(a, b, c);
	}
}